

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_ci.cpp
# Opt level: O2

void msd_ci(uchar **strings,size_t n)

{
  ostream *poVar1;
  
  if (-1 < (long)n) {
    msd_ci<unsigned_long>(strings,n,0);
    return;
  }
  poVar1 = std::operator<<((ostream *)&std::cerr,"ERROR: ");
  poVar1 = std::operator<<(poVar1,"msd_ci");
  poVar1 = std::operator<<(poVar1,"(): too many input strings: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,n);
  poVar1 = std::operator<<(poVar1," > ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x7fffffffffffffff);
  std::endl<char,std::char_traits<char>>(poVar1);
  abort();
}

Assistant:

void msd_ci(unsigned char** strings, size_t n)
{
	if (n > size_t(std::numeric_limits<ssize_t>::max())) {
		std::cerr << "ERROR: "
			<< __func__ << "(): too many input strings: "
			<< n << " > " << std::numeric_limits<ssize_t>::max()
			<< std::endl;
		abort();
	}
	msd_ci<size_t>(strings, n, 0);
}